

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

CURLcode Curl_pp_vsendf(pingpong *pp,char *fmt,__va_list_tag *args)

{
  connectdata *conn;
  CURLcode CVar1;
  char *format;
  char *__s;
  size_t len;
  curltime cVar2;
  ssize_t bytes_written;
  size_t local_38;
  
  conn = pp->conn;
  if (conn == (connectdata *)0x0) {
    CVar1 = CURLE_SEND_ERROR;
  }
  else {
    format = curl_maprintf("%s\r\n");
    CVar1 = CURLE_OUT_OF_MEMORY;
    if (format != (char *)0x0) {
      __s = curl_mvaprintf(format,args);
      (*Curl_cfree)(format);
      if (__s != (char *)0x0) {
        local_38 = 0;
        len = strlen(__s);
        pp->nread_resp = 0;
        pp->linestart_resp = (pp->conn->data->state).buffer;
        pp->pending_resp = true;
        cVar2 = Curl_now();
        (pp->response).tv_sec = cVar2.tv_sec;
        (pp->response).tv_usec = cVar2.tv_usec;
        CVar1 = Curl_write(conn,conn->sock[0],__s,len,(ssize_t *)&local_38);
        if (CVar1 == CURLE_OK) {
          if (((conn->data->set).field_0x87b & 0x40) != 0) {
            Curl_debug(conn->data,CURLINFO_HEADER_OUT,__s,local_38);
          }
          if (len - local_38 == 0) {
            (*Curl_cfree)(__s);
            pp->sendthis = (char *)0x0;
            pp->sendleft = 0;
            pp->sendsize = 0;
            cVar2 = Curl_now();
            (pp->response).tv_sec = cVar2.tv_sec;
            (pp->response).tv_usec = cVar2.tv_usec;
          }
          else {
            pp->sendthis = __s;
            pp->sendsize = len;
            pp->sendleft = len - local_38;
          }
          CVar1 = CURLE_OK;
        }
        else {
          (*Curl_cfree)(__s);
        }
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_pp_vsendf(struct pingpong *pp,
                        const char *fmt,
                        va_list args)
{
  ssize_t bytes_written;
  size_t write_len;
  char *fmt_crlf;
  char *s;
  CURLcode result;
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data;

#ifdef HAVE_GSSAPI
  enum protection_level data_sec;
#endif

  DEBUGASSERT(pp->sendleft == 0);
  DEBUGASSERT(pp->sendsize == 0);
  DEBUGASSERT(pp->sendthis == NULL);

  if(!conn)
    /* can't send without a connection! */
    return CURLE_SEND_ERROR;

  data = conn->data;

  fmt_crlf = aprintf("%s\r\n", fmt); /* append a trailing CRLF */
  if(!fmt_crlf)
    return CURLE_OUT_OF_MEMORY;

  s = vaprintf(fmt_crlf, args); /* trailing CRLF appended */
  free(fmt_crlf);
  if(!s)
    return CURLE_OUT_OF_MEMORY;

  bytes_written = 0;
  write_len = strlen(s);

  Curl_pp_init(pp);

  result = Curl_convert_to_network(data, s, write_len);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    free(s);
    return result;
  }

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CMD;
#endif
  result = Curl_write(conn, conn->sock[FIRSTSOCKET], s, write_len,
                     &bytes_written);
#ifdef HAVE_GSSAPI
  data_sec = conn->data_prot;
  DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
  conn->data_prot = data_sec;
#endif

  if(result) {
    free(s);
    return result;
  }

  if(conn->data->set.verbose)
    Curl_debug(conn->data, CURLINFO_HEADER_OUT, s, (size_t)bytes_written);

  if(bytes_written != (ssize_t)write_len) {
    /* the whole chunk was not sent, keep it around and adjust sizes */
    pp->sendthis = s;
    pp->sendsize = write_len;
    pp->sendleft = write_len - bytes_written;
  }
  else {
    free(s);
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }

  return CURLE_OK;
}